

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

int re2::Regexp::FactorAlternationRecursive(Regexp **sub,int n,ParseFlags altflags,int maxdepth)

{
  Regexp *pRVar1;
  ParseFlags flags;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Rune *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ostream *poVar7;
  CharClass *pCVar8;
  Regexp *pRVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  Rune *pRVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  Regexp *b;
  ParseFlags runeflags_i;
  int nrune_i;
  Regexp *x [2];
  string local_228;
  ulong local_208;
  long local_200;
  CharClassBuilder local_1f8;
  undefined1 local_1b8 [392];
  
  if (0 < maxdepth) {
    uVar12 = 0;
    uVar10 = 0;
    if (-1 < n) {
      uVar20 = (ulong)(n + 1);
      uVar19 = 0;
      pRVar14 = (Rune *)0x0;
      uVar10 = 0;
      uVar16 = 0;
      flags = NoParseFlags;
      uVar18 = 0;
      local_208 = uVar20;
      do {
        local_1f8.upper_ = 0;
        local_228._M_dataplus._M_p._0_4_ = NoParseFlags;
        iVar3 = (int)uVar18;
        if (uVar19 < (uint)n) {
          pRVar5 = LeadingString(sub[uVar19],(int *)&local_1f8,(ParseFlags *)&local_228);
          if ((ParseFlags)local_228._M_dataplus._M_p != flags) goto LAB_0012de44;
          uVar11 = (ulong)local_1f8.upper_;
          if (iVar3 < (int)local_1f8.upper_) {
            uVar11 = uVar18;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          else {
            uVar13 = 0;
            do {
              if (pRVar14[uVar13] != pRVar5[uVar13]) {
                uVar11 = uVar13 & 0xffffffff;
                break;
              }
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
          }
          if ((int)uVar11 == 0) goto LAB_0012de44;
        }
        else {
          pRVar5 = (Rune *)0x0;
LAB_0012de44:
          iVar15 = (int)uVar16;
          if (uVar19 != uVar16) {
            uVar11 = (ulong)iVar15;
            lVar17 = (long)(int)uVar10;
            if (uVar19 == iVar15 + 1) {
              uVar10 = uVar10 + 1;
              sub[lVar17] = sub[uVar11];
            }
            else {
              local_200 = lVar17;
              local_1b8._0_8_ = LiteralString(pRVar14,iVar3,flags);
              uVar20 = uVar11;
              if ((long)uVar11 < (long)uVar19) {
                do {
                  uVar13 = uVar20 + 1;
                  RemoveLeadingString(sub[uVar20],iVar3);
                  uVar20 = uVar13;
                } while ((uVar13 & 0xffffffff) != uVar19);
              }
              iVar3 = FactorAlternationRecursive
                                (sub + uVar11,(int)uVar19 - iVar15,altflags,maxdepth + -1);
              local_1b8._8_8_ = AlternateNoFactor(sub + uVar11,iVar3,altflags);
              pRVar9 = Concat((Regexp **)local_1b8,2,altflags);
              uVar10 = (int)local_200 + 1;
              sub[local_200] = pRVar9;
              uVar20 = local_208;
            }
          }
          uVar11 = uVar18;
          if (uVar19 < (uint)n) {
            uVar16 = uVar19 & 0xffffffff;
            pRVar14 = pRVar5;
            uVar11 = (ulong)local_1f8.upper_;
            flags = (ParseFlags)local_228._M_dataplus._M_p;
          }
        }
        uVar19 = uVar19 + 1;
        uVar18 = uVar11;
      } while (uVar19 != uVar20);
    }
    if (-1 < (int)uVar10) {
      uVar20 = 0;
      pRVar9 = (Regexp *)0x0;
      uVar12 = 0;
      uVar18 = 0;
      do {
        b = pRVar9;
        if (uVar20 < uVar10) {
          pRVar1 = sub[uVar20];
          if (pRVar1->op_ == '\x02') {
            b = (Regexp *)0x0;
          }
          else {
            b = pRVar1;
            if ((pRVar1->op_ == '\x05') && (1 < pRVar1->nsub_)) {
              b = (Regexp *)0x0;
              if ((*(pRVar1->field_5).submany_)->op_ != '\x02') {
                b = *(pRVar1->field_5).submany_;
              }
            }
          }
          if ((pRVar9 == (Regexp *)0x0) || (bVar2 = Equal(pRVar9,b), !bVar2)) goto LAB_0012e008;
          if (8 < pRVar9->op_ - 0xc) {
            if ((pRVar9->op_ == 10) &&
               ((pRVar9->field_7).field_0.min_ == (pRVar9->field_7).field_0.max_)) {
              if (pRVar9->nsub_ < 2) {
                paVar6 = &pRVar9->field_5;
              }
              else {
                paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar9->field_5).submany_;
              }
              if ((paVar6->subone_->op_ < 0x15) &&
                 ((0x103008U >> (paVar6->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_0012e0da;
            }
            goto LAB_0012e008;
          }
        }
        else {
LAB_0012e008:
          iVar3 = (int)uVar18;
          if (uVar20 != uVar18) {
            if (uVar20 == iVar3 + 1) {
              lVar17 = (long)(int)uVar12;
              uVar12 = uVar12 + 1;
              sub[lVar17] = sub[iVar3];
            }
            else {
              local_1b8._0_8_ = Incref(pRVar9);
              uVar19 = (ulong)iVar3;
              uVar16 = uVar19;
              if ((long)uVar19 < (long)uVar20) {
                do {
                  uVar11 = uVar16 + 1;
                  pRVar9 = RemoveLeadingRegexp(sub[uVar16]);
                  sub[uVar16] = pRVar9;
                  uVar16 = uVar11;
                } while ((uVar11 & 0xffffffff) != uVar20);
              }
              iVar3 = FactorAlternationRecursive
                                (sub + uVar19,(int)uVar20 - iVar3,altflags,maxdepth + -1);
              local_1b8._8_8_ = AlternateNoFactor(sub + uVar19,iVar3,altflags);
              pRVar9 = Concat((Regexp **)local_1b8,2,altflags);
              lVar17 = (long)(int)uVar12;
              uVar12 = uVar12 + 1;
              sub[lVar17] = pRVar9;
            }
          }
          pRVar9 = b;
          if (uVar20 < uVar10) {
            uVar18 = uVar20 & 0xffffffff;
          }
        }
LAB_0012e0da:
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar10 + 1);
    }
    uVar10 = 0;
    if (-1 < (int)uVar12) {
      uVar18 = 0;
      uVar10 = 0;
      uVar4 = 0;
      do {
        if ((uVar12 <= uVar18) || ((sub[uVar18]->op_ != '\x03' && (sub[uVar18]->op_ != '\x14')))) {
          if (uVar18 != uVar4) {
            if (uVar18 == uVar4 + 1) {
              lVar17 = (long)(int)uVar10;
              uVar10 = uVar10 + 1;
              sub[lVar17] = sub[(int)uVar4];
            }
            else {
              uVar20 = (ulong)(int)uVar4;
              CharClassBuilder::CharClassBuilder(&local_1f8);
              if ((long)uVar20 < (long)uVar18) {
                do {
                  pRVar9 = sub[uVar20];
                  if (pRVar9->op_ == '\x03') {
                    CharClassBuilder::AddRangeFlags
                              (&local_1f8,(pRVar9->field_7).rune_,(pRVar9->field_7).rune_,
                               (uint)pRVar9->parse_flags_);
                  }
                  else if (pRVar9->op_ == '\x14') {
                    pCVar8 = (pRVar9->field_7).field_3.cc_;
                    if (*(int *)(pCVar8 + 0x10) != 0) {
                      pRVar14 = *(Rune **)(pCVar8 + 8);
                      do {
                        CharClassBuilder::AddRange(&local_1f8,*pRVar14,pRVar14[1]);
                        pRVar14 = pRVar14 + 2;
                      } while (pRVar14 !=
                               (Rune *)((long)*(int *)(pCVar8 + 0x10) * 8 + *(long *)(pCVar8 + 8)));
                    }
                  }
                  else {
                    LogMessage::LogMessage
                              ((LogMessage *)local_1b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc"
                               ,0x409,3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b8 + 8),"RE2: unexpected op: ",0x14);
                    poVar7 = (ostream *)
                             std::ostream::operator<<((ostream *)(local_1b8 + 8),(uint)pRVar9->op_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ToString_abi_cxx11_(&local_228,pRVar9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,(char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                                       (ParseFlags)local_228._M_dataplus._M_p),
                               local_228._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                    (ParseFlags)local_228._M_dataplus._M_p) != &local_228.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                               (ParseFlags)local_228._M_dataplus._M_p));
                    }
                    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
                  }
                  Decref(pRVar9);
                  uVar20 = uVar20 + 1;
                } while ((uVar20 & 0xffffffff) != uVar18);
              }
              pCVar8 = CharClassBuilder::GetCharClass(&local_1f8);
              pRVar9 = NewCharClass(pCVar8,altflags);
              lVar17 = (long)(int)uVar10;
              uVar10 = uVar10 + 1;
              sub[lVar17] = pRVar9;
              std::
              _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
              ::~_Rb_tree(&local_1f8.ranges_._M_t);
            }
          }
          if (uVar18 < uVar12) {
            lVar17 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            sub[lVar17] = sub[uVar18];
          }
          uVar4 = (int)uVar18 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar12 + 1);
    }
    n = 0;
    if (0 < (int)uVar10) {
      n = 0;
      uVar18 = 1;
      do {
        if (((uVar18 < uVar10) && (sub[uVar18 - 1]->op_ == '\x02')) && (sub[uVar18]->op_ == '\x02'))
        {
          Decref(sub[uVar18 - 1]);
        }
        else {
          lVar17 = (long)n;
          n = n + 1;
          sub[lVar17] = sub[uVar18 - 1];
        }
        bVar2 = uVar18 != uVar10;
        uVar18 = uVar18 + 1;
      } while (bVar2);
    }
  }
  return n;
}

Assistant:

int Regexp::FactorAlternationRecursive(
    Regexp** sub, int n,
    Regexp::ParseFlags altflags,
    int maxdepth) {

  if (maxdepth <= 0)
    return n;

  // Round 1: Factor out common literal prefixes.
  Rune *rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  int start = 0;
  int out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin
    // with the string rune[0:nrune].

    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < n) {
      rune_i = LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune] but sub[i]
    // does not even begin with rune[0].
    //
    // Factor out common string and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        RemoveLeadingString(sub[j], nrune);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                          maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
  n = out;

  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  start = 0;
  out = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin with first.

    Regexp* first_i = NULL;
    if (i < n) {
      first_i = LeadingRegexp(sub[i]);
      if (first != NULL && Regexp::Equal(first, first_i) &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte)))) {
        continue;
      }
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first but sub[i] does not.
    //
    // Factor out common regexp and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = RemoveLeadingRegexp(sub[j]);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                   maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      first = first_i;
    }
  }
  n = out;

  // Round 3: Collapse runs of single literals into character classes.
  start = 0;
  out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that are either
    // literal runes or character classes.

    if (i < n &&
        (sub[i]->op() == kRegexpLiteral ||
         sub[i]->op() == kRegexpCharClass))
      continue;

    // sub[i] is not a char or char class;
    // emit char class for sub[start:i]...
    if (i == start) {
      // Nothing to do.
    } else if (i == start+1) {
      sub[out++] = sub[start];
    } else {
      // Make new char class.
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      sub[out++] = NewCharClass(ccb.GetCharClass(), altflags);
    }

    // ... and then emit sub[i].
    if (i < n)
      sub[out++] = sub[i];
    start = i+1;
  }
  n = out;

  // Round 4: Collapse runs of empty matches into single empty match.
  start = 0;
  out = 0;
  for (int i = 0; i < n; i++) {
    if (i + 1 < n &&
        sub[i]->op() == kRegexpEmptyMatch &&
        sub[i+1]->op() == kRegexpEmptyMatch) {
      sub[i]->Decref();
      continue;
    }
    sub[out++] = sub[i];
  }
  n = out;

  return n;
}